

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_12_obmc_variance32x32_c
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar5 = (long)pre * 2;
  lVar4 = 0;
  lVar6 = 0;
  iVar7 = 0;
  do {
    lVar1 = 0;
    do {
      iVar2 = wsrc[lVar1] - (uint)*(ushort *)(lVar5 + lVar1 * 2) * mask[lVar1];
      if (iVar2 < 0) {
        uVar3 = -(0x800U - iVar2 >> 0xc);
      }
      else {
        uVar3 = iVar2 + 0x800U >> 0xc;
      }
      lVar4 = lVar4 + (int)uVar3;
      lVar6 = lVar6 + (ulong)(uVar3 * uVar3);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
    wsrc = wsrc + 0x20;
    mask = mask + 0x20;
    iVar7 = iVar7 + 1;
    lVar5 = lVar5 + (long)pre_stride * 2;
  } while (iVar7 != 0x20);
  uVar3 = (uint)((ulong)(lVar6 + 0x80) >> 8);
  *sse = uVar3;
  lVar5 = lVar4 * 0x10000000 + 0x80000000 >> 0x20;
  lVar5 = (ulong)uVar3 - ((ulong)(lVar5 * lVar5) >> 10);
  uVar3 = (uint)lVar5;
  if (lVar5 < 0) {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}